

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

boolean get_mon_location(monst *mon,xchar *xp,xchar *yp,int locflags)

{
  int locflags_local;
  xchar *yp_local;
  xchar *xp_local;
  monst *mon_local;
  
  if (mon == &youmonst) {
    *xp = u.ux;
    *yp = u.uy;
    mon_local._7_1_ = '\x01';
  }
  else if ((mon->mx < '\x01') || (((*(uint *)&mon->field_0x60 >> 9 & 1) != 0 && (locflags == 0)))) {
    *yp = '\0';
    *xp = '\0';
    mon_local._7_1_ = '\0';
  }
  else {
    *xp = mon->mx;
    *yp = mon->my;
    mon_local._7_1_ = '\x01';
  }
  return mon_local._7_1_;
}

Assistant:

boolean get_mon_location(struct monst *mon, xchar *xp, xchar *yp, int locflags)
{
	if (mon == &youmonst) {
	    *xp = u.ux;
	    *yp = u.uy;
	    return TRUE;
	} else if (mon->mx > 0 && (!mon->mburied || locflags)) {
	    *xp = mon->mx;
	    *yp = mon->my;
	    return TRUE;
	} else {	/* migrating or buried */
	    *xp = *yp = 0;
	    return FALSE;
	}
}